

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>_>::~BasicTypeInfo
          (BasicTypeInfo<std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>_> *this)

{
  BasicTypeInfo<std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>_> *this_local;
  
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_01520748;
  std::__cxx11::string::~string((string *)&this->name_);
  TypeInfo::~TypeInfo(&this->super_TypeInfo);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}